

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slice.h
# Opt level: O1

int64_t __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
getUTCDate(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  Exception *this_00;
  
  if (**(char **)this == '\x1c') {
    return *(int64_t *)(*(char **)this + 1);
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_00,InvalidValueType,"Expecting type UTCDate");
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

uint8_t const* getDataPtr() const noexcept { return _start; }